

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psobjs.c
# Opt level: O1

FT_Error ps_parser_load_field_table
                   (PS_Parser parser,T1_Field field,void **objects,FT_UInt max_objects,
                   FT_ULong *pflags)

{
  bool bVar1;
  undefined4 uVar2;
  FT_Error FVar3;
  uint uVar4;
  FT_UInt FVar5;
  uint uVar6;
  T1_Token tokens;
  T1_FieldRec fieldrec;
  T1_TokenRec elements [32];
  uint local_380;
  FT_UInt local_37c;
  FT_Byte *local_378;
  FT_Byte *local_370;
  T1_FieldRec_ local_368;
  T1_TokenRec_ local_338 [32];
  
  local_368.ident = field->ident;
  uVar2 = field->location;
  local_368.reader = field->reader;
  local_368.offset = field->offset;
  local_368.size = field->size;
  local_368._29_3_ = *(undefined3 *)&field->field_0x1d;
  local_368.array_max = field->array_max;
  local_368.count_offset = field->count_offset;
  local_368.dict = field->dict;
  local_368._44_4_ = *(undefined4 *)&field->field_0x2c;
  local_368.type = T1_FIELD_TYPE_INTEGER;
  local_368.location = uVar2;
  if ((field->type == T1_FIELD_TYPE_FIXED_ARRAY) || (field->type == T1_FIELD_TYPE_BBOX)) {
    local_368.type = T1_FIELD_TYPE_FIXED;
  }
  tokens = local_338;
  local_37c = max_objects;
  ps_parser_to_token_array(parser,tokens,0x20,(FT_Int *)&local_380);
  if ((int)local_380 < 0) {
    FVar3 = 0xa2;
  }
  else {
    if (field->array_max < local_380) {
      local_380 = field->array_max;
    }
    local_370 = parser->cursor;
    local_378 = parser->limit;
    if ((field->type != T1_FIELD_TYPE_BBOX) && ((ulong)field->count_offset != 0)) {
      *(undefined1 *)((long)*objects + (ulong)field->count_offset) = (undefined1)local_380;
    }
    if ((int)local_380 < 1) {
      FVar3 = 0;
    }
    else {
      uVar4 = (uint)local_368.size;
      uVar6 = local_380;
      FVar5 = local_368.offset;
      do {
        FVar5 = FVar5 + uVar4;
        parser->cursor = tokens->start;
        parser->limit = tokens->limit;
        FVar3 = ps_parser_load_field(parser,&local_368,objects,local_37c,pflags);
        if (FVar3 != 0) goto LAB_00231c24;
        local_368.offset = FVar5;
        tokens = tokens + 1;
        bVar1 = 1 < (int)uVar6;
        uVar6 = uVar6 - 1;
      } while (bVar1);
      FVar3 = 0;
    }
LAB_00231c24:
    parser->cursor = local_370;
    parser->limit = local_378;
  }
  return FVar3;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  ps_parser_load_field_table( PS_Parser       parser,
                              const T1_Field  field,
                              void**          objects,
                              FT_UInt         max_objects,
                              FT_ULong*       pflags )
  {
    T1_TokenRec  elements[T1_MAX_TABLE_ELEMENTS];
    T1_Token     token;
    FT_Int       num_elements;
    FT_Error     error = FT_Err_Ok;
    FT_Byte*     old_cursor;
    FT_Byte*     old_limit;
    T1_FieldRec  fieldrec = *(T1_Field)field;


    fieldrec.type = T1_FIELD_TYPE_INTEGER;
    if ( field->type == T1_FIELD_TYPE_FIXED_ARRAY ||
         field->type == T1_FIELD_TYPE_BBOX        )
      fieldrec.type = T1_FIELD_TYPE_FIXED;

    ps_parser_to_token_array( parser, elements,
                              T1_MAX_TABLE_ELEMENTS, &num_elements );
    if ( num_elements < 0 )
    {
      error = FT_ERR( Ignore );
      goto Exit;
    }
    if ( (FT_UInt)num_elements > field->array_max )
      num_elements = (FT_Int)field->array_max;

    old_cursor = parser->cursor;
    old_limit  = parser->limit;

    /* we store the elements count if necessary;           */
    /* we further assume that `count_offset' can't be zero */
    if ( field->type != T1_FIELD_TYPE_BBOX && field->count_offset != 0 )
      *(FT_Byte*)( (FT_Byte*)objects[0] + field->count_offset ) =
        (FT_Byte)num_elements;

    FT_TRACE4(( " [" ));

    /* we now load each element, adjusting the field.offset on each one */
    token = elements;
    for ( ; num_elements > 0; num_elements--, token++ )
    {
      parser->cursor = token->start;
      parser->limit  = token->limit;

      error = ps_parser_load_field( parser,
                                    &fieldrec,
                                    objects,
                                    max_objects,
                                    0 );
      if ( error )
        break;

      fieldrec.offset += fieldrec.size;
    }

    FT_TRACE4(( "]" ));

#if 0  /* obsolete -- keep for reference */
    if ( pflags )
      *pflags |= 1L << field->flag_bit;
#else
    FT_UNUSED( pflags );
#endif

    parser->cursor = old_cursor;
    parser->limit  = old_limit;

  Exit:
    return error;
  }